

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QSize __thiscall
QStyleSheetStyle::sizeFromContents
          (QStyleSheetStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *w)

{
  QLatin1StringView sh;
  QSize sz_00;
  QByteArrayView layout_00;
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  QStyle *pQVar7;
  QStyleOptionSpinBox *pQVar8;
  QStyleOptionHeader *pQVar9;
  QAbstractSpinBox *pQVar10;
  QStyleOptionButton *pQVar11;
  QStyleOptionMenuItem *pQVar12;
  QComboBox *pQVar13;
  ulong uVar14;
  QStyleOptionTab *pQVar15;
  QStyleOptionComplex *pQVar16;
  QVariant *pQVar17;
  int *piVar18;
  QSize *in_RCX;
  QStyleOption *in_RDX;
  int in_ESI;
  undefined8 uVar19;
  QStyleSheetStyle *in_RDI;
  QWidget *in_R8;
  long in_FS_OFFSET;
  SubControl sc;
  int layoutButton;
  QVariant *val;
  add_const_t<QList<QVariant>_> *__range3;
  int width;
  QStyleOptionComplex *ccOpt;
  QStyleOptionTab *tab;
  bool vertical;
  int spaceForIcon;
  PseudoElement pe_1;
  int pmSmall;
  bool drawCheckMark;
  PseudoElement pe;
  QStyleOptionMenuItem *mi;
  int spacing;
  int iw;
  bool isRadio;
  QStyleOptionButton *btn;
  int margin;
  bool nullIcon;
  QStyleOptionHeader *hdr;
  QStyleOptionSpinBox *spinbox;
  QSize sz_2;
  const_iterator __end3;
  const_iterator __begin3;
  int height;
  QList<QVariant> layout;
  QSize textSize;
  QFontMetrics fm_2;
  QSize oldTextSize;
  QString text;
  QRect checkmarkRect;
  QSize pmSize;
  QRect r_1;
  QFontMetrics fm_1;
  QSize sz_1;
  int ih;
  QRect arrowRect;
  QSize txt;
  QFontMetrics fm;
  int iconSize;
  QSize nativeContentsSize;
  QSize baseSize;
  QRect comboRect;
  QSize defaultUpSize;
  QRect r;
  QSize sz;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRenderRule subRule_7;
  QRenderRule subRule_6;
  QFont ruleFont;
  QRenderRule subRule_5;
  QRenderRule subRule_4;
  QRenderRule subSubRule;
  QRenderRule subRule_3;
  QFont styleFont;
  QRenderRule subRule_2;
  QRenderRule subRule_1;
  QRenderRule subRule;
  QRenderRule rule;
  int in_stack_fffffffffffff648;
  LayoutDirection LVar20;
  CaseSensitivity in_stack_fffffffffffff64c;
  QRenderRule *in_stack_fffffffffffff650;
  int in_stack_fffffffffffff658;
  undefined2 in_stack_fffffffffffff65c;
  QChar in_stack_fffffffffffff65e;
  int in_stack_fffffffffffff660;
  int in_stack_fffffffffffff664;
  QRenderRule *in_stack_fffffffffffff668;
  QRenderRule *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  QRenderRule *in_stack_fffffffffffff688;
  Representation in_stack_fffffffffffff690;
  Representation in_stack_fffffffffffff694;
  QStyleSheetStyle *in_stack_fffffffffffff698;
  QWidget *in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6bc;
  QStyleOption *in_stack_fffffffffffff6c0;
  ContentsType in_stack_fffffffffffff6cc;
  LayoutDirection LVar21;
  QWindowsStyle *in_stack_fffffffffffff6d0;
  int local_8fc;
  int in_stack_fffffffffffff714;
  QObject *obj;
  undefined8 in_stack_fffffffffffff778;
  QStyleOption *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  uint uVar22;
  undefined4 in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  byte local_865;
  int local_82c;
  int local_7d8;
  QSize local_7d4;
  QFlagsStorage<QStyle::SubControl> local_7cc;
  QVariant *local_7c8;
  const_iterator local_7c0;
  const_iterator local_7b8;
  int local_7ac [11];
  undefined1 *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  QSize local_768;
  QSize local_760;
  int local_758;
  int local_754;
  int local_750;
  int local_74c;
  undefined1 *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  QSize local_728;
  QString local_720;
  undefined8 local_704;
  QSize local_6fc;
  int local_6f4;
  undefined1 local_6f0 [16];
  int local_6e0;
  undefined1 local_6dc [8];
  undefined1 *local_6d4;
  QChar local_6ca;
  QSize local_6c8;
  QSize local_6c0;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 *local_698;
  QSize local_68c;
  QSize local_684;
  int local_67c;
  int local_678;
  undefined1 local_674 [16];
  QSize local_664;
  QSize local_65c;
  int local_654;
  undefined1 *local_650;
  QFontMetrics local_648 [8];
  undefined1 *local_640;
  int local_634;
  undefined1 *local_630;
  undefined1 *local_628;
  QSize local_620;
  QSize local_618;
  undefined1 local_608 [24];
  QSize local_5f0;
  QSize local_5e8;
  undefined1 local_5e0 [16];
  QSize local_5d0;
  QSize local_5c8;
  QStyleSheetStyleRecursionGuard local_5b9;
  QSize local_5b8;
  undefined1 local_5b0 [136];
  undefined1 local_528 [136];
  undefined1 *local_4a0;
  undefined1 *local_498;
  undefined1 local_490 [16];
  QRenderRule QStack_480;
  undefined1 local_380 [136];
  QFont local_2f8 [16];
  undefined1 local_2e8 [32];
  byte local_2c8;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 local_250 [16];
  QFont aQStack_240 [16];
  byte local_230;
  undefined1 local_1c8 [136];
  undefined1 local_140 [136];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QVariant local_28;
  long local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar7 = baseStyle((QStyleSheetStyle *)
                       CONCAT26(in_stack_fffffffffffff65e.ucs,
                                CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
    local_5b8 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,in_ESI,in_RDX,in_RCX,in_R8);
    goto LAB_0043e291;
  }
  local_5b9.guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_5b9,in_RDI);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  obj = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             in_stack_fffffffffffff780,iVar6);
  local_5c8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_5c8 = QRenderRule::adjustSize(in_stack_fffffffffffff670,(QSize *)in_stack_fffffffffffff668);
  switch(in_ESI) {
  case 1:
  case 2:
    pQVar11 = qstyleoption_cast<QStyleOptionButton_const*>(in_RDX);
    if (pQVar11 == (QStyleOptionButton *)0x0) goto LAB_0043e22c;
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if ((!bVar3) && (bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650), !bVar3)) {
      bVar3 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),obj
                           ,in_stack_fffffffffffff714);
      if (!bVar3) goto LAB_0043e22c;
    }
    bVar3 = in_ESI == 2;
    uVar19 = 0x25;
    if (bVar3) {
      uVar19 = 0x27;
    }
    (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle + 0xe0))
              (in_RDI,uVar19,pQVar11,in_R8);
    uVar19 = 0x26;
    if (bVar3) {
      uVar19 = 0x28;
    }
    local_678 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle
                            + 0xe0))(in_RDI,uVar19,pQVar11,in_R8);
    uVar19 = 0x43;
    if (bVar3) {
      uVar19 = 0x4a;
    }
    (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle + 0xe0))
              (in_RDI,uVar19,pQVar11,in_R8);
    QSize::width((QSize *)0x43cf70);
    QSize::setWidth((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
    local_67c = QSize::height((QSize *)0x43cf9a);
    qMax<int>(&local_67c,&local_678);
    QSize::setHeight((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
    local_5b8 = QRenderRule::boxSize
                          (in_stack_fffffffffffff668,
                           (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                           CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    break;
  case 3:
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if (((bVar3) ||
        (bVar3 = QRenderRule::hasNativeBorder
                           ((QRenderRule *)
                            CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660)), !bVar3))
       || (bVar3 = QRenderRule::baseStyleCanDraw
                             ((QRenderRule *)
                              CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648)), !bVar3
          )) {
      QSize::QSize((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                   in_stack_fffffffffffff648);
      QSize::operator+=((QSize *)in_stack_fffffffffffff650,
                        (QSize *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
    }
  case 0:
  case 4:
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if ((bVar3) ||
       (bVar3 = QRenderRule::hasNativeBorder
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660)), !bVar3))
    {
      LVar21 = (LayoutDirection)in_stack_fffffffffffff6d0;
      if (in_ESI == 4) {
        memset(local_1c8,0xaa,0x88);
        renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790)
                   ,(QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                   in_stack_fffffffffffff780,iVar6);
        local_608._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_608._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        LVar20 = in_RDX->direction;
        local_608._0_16_ =
             (undefined1  [16])
             positionRect(in_stack_fffffffffffff698,
                          (QWidget *)
                          CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),
                          in_stack_fffffffffffff688,
                          (QRenderRule *)
                          CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                          in_stack_fffffffffffff67c,(QRect *)in_stack_fffffffffffff670,LVar21);
        QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff64c,LVar20));
        QSize::QSize((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,LVar20);
        QSize::operator+=((QSize *)in_stack_fffffffffffff650,
                          (QSize *)CONCAT44(in_stack_fffffffffffff64c,LVar20));
        QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
      }
      local_5b8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      auVar1._8_8_ = local_674._8_8_;
      auVar1._0_8_ = local_674._0_8_;
    }
    else {
      bVar3 = QRenderRule::baseStyleCanDraw
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      if (bVar3) {
        pQVar7 = baseStyle((QStyleSheetStyle *)
                           CONCAT26(in_stack_fffffffffffff65e.ucs,
                                    CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
        local_618 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))
                                     (pQVar7,in_ESI,in_RDX,&local_5c8,in_R8);
      }
      else {
        local_618 = QWindowsStyle::sizeFromContents
                              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,
                               in_stack_fffffffffffff6c0,
                               (QSize *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8
                                                ),in_stack_fffffffffffff6b0);
      }
      local_5c8 = local_618;
      local_5b8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      auVar1._8_8_ = local_674._8_8_;
      auVar1._0_8_ = local_674._0_8_;
    }
    break;
  case 5:
  case 8:
    uVar5 = 10;
    if (in_ESI == 5) {
      uVar5 = 0x20;
    }
    memset(&QStack_480.clipset,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,uVar5),
               (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               in_stack_fffffffffffff780,iVar6);
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if ((bVar3) || (bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650), bVar3)) {
      local_5b8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      local_82c = 1;
    }
    else {
      local_82c = 2;
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    goto joined_r0x0043dcf5;
  case 6:
  case 0x10:
    bVar3 = QRenderRule::hasContentsSize(in_stack_fffffffffffff650);
    if (bVar3) {
      local_5b8 = QRenderRule::size((QRenderRule *)
                                    CONCAT26(in_stack_fffffffffffff65e.ucs,
                                             CONCAT24(in_stack_fffffffffffff65c,
                                                      in_stack_fffffffffffff658)),
                                    (QSize *)in_stack_fffffffffffff650);
      auVar1._8_8_ = local_674._8_8_;
      auVar1._0_8_ = local_674._0_8_;
    }
    else {
      pQVar7 = baseStyle((QStyleSheetStyle *)
                         CONCAT26(in_stack_fffffffffffff65e.ucs,
                                  CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
      local_704 = (**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,in_ESI,in_RDX,&local_5c8,in_R8);
      local_5b8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      auVar1._8_8_ = local_674._8_8_;
      auVar1._0_8_ = local_674._0_8_;
    }
    break;
  case 7:
    pQVar12 = qstyleoption_cast<QStyleOptionMenuItem_const*>(in_RDX);
    LVar21 = (LayoutDirection)in_stack_fffffffffffff6d0;
    if (pQVar12 != (QStyleOptionMenuItem *)0x0) {
      iVar4 = 10;
      if (pQVar12->menuItemType == Separator) {
        iVar4 = 0x26;
      }
      memset(local_2e8,0xaa,0x88);
      renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                 (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                 in_stack_fffffffffffff780,iVar6);
      if ((iVar4 == 0x26) &&
         (bVar3 = QRenderRule::hasContentsSize(in_stack_fffffffffffff650), bVar3)) {
        QSize::width((QSize *)0x43d0fb);
        local_684 = QRenderRule::size((QRenderRule *)
                                      CONCAT26(in_stack_fffffffffffff65e.ucs,
                                               CONCAT24(in_stack_fffffffffffff65c,
                                                        in_stack_fffffffffffff658)));
        QSize::height((QSize *)0x43d124);
        QSize::QSize((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                     in_stack_fffffffffffff648);
        bVar3 = true;
      }
      else if ((iVar4 == 10) &&
              (((bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650), bVar3 ||
                (bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650), bVar3)) ||
               ((local_2c8 & 1) != 0)))) {
        local_865 = pQVar12->menuHasCheckableItems & 1;
        pQVar13 = qobject_cast<QComboBox_const*>((QObject *)0x43d1a9);
        if (pQVar13 != (QComboBox *)0x0) {
          local_865 = 0;
        }
        local_68c = *in_RCX;
        if ((local_2c8 & 1) != 0) {
          local_698 = &DAT_aaaaaaaaaaaaaaaa;
          QFont::resolve(local_2f8);
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_698,local_2f8);
          QFont::~QFont(local_2f8);
          local_6a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_6a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRect::QRect((QRect *)in_stack_fffffffffffff650);
          local_6a8 = QFontMetrics::boundingRect
                                ((QRect *)&local_698,(int)local_6b8,(QString *)0x900,
                                 (int)pQVar12 + 0x60,(int *)0x0);
          local_6c8 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffff664,
                                                    in_stack_fffffffffffff660));
          local_6c0 = QSize::expandedTo((QSize *)CONCAT26(in_stack_fffffffffffff65e.ucs,
                                                          CONCAT24(in_stack_fffffffffffff65c,
                                                                   in_stack_fffffffffffff658)),
                                        (QSize *)in_stack_fffffffffffff650);
          local_68c = local_6c0;
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_698);
        }
        QChar::QChar<char16_t,_true>(&local_6ca,L'\t');
        bVar3 = QString::contains((QString *)in_stack_fffffffffffff650,in_stack_fffffffffffff65e,
                                  in_stack_fffffffffffff64c);
        if (bVar3) {
          piVar18 = QSize::rwidth((QSize *)0x43d345);
          *piVar18 = *piVar18 + 0xc;
        }
        uVar14 = QIcon::isNull();
        if ((uVar14 & 1) == 0) {
          (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle +
                      0xe0))(in_RDI,0x3e,0);
          local_6d4 = &DAT_aaaaaaaaaaaaaaaa;
          QSize::QSize((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                       in_stack_fffffffffffff648);
          local_6d4 = (undefined1 *)QIcon::actualSize((QSize *)&pQVar12->icon,(Mode)local_6dc,On);
          piVar18 = &pQVar12->maxIconWidth;
          local_6e0 = QSize::width((QSize *)0x43d403);
          piVar18 = std::max<int>(piVar18,&local_6e0);
          iVar6 = *piVar18 + 4;
          piVar18 = QSize::rwidth((QSize *)0x43d432);
          *piVar18 = iVar6 + *piVar18;
        }
        else if (local_865 == 0) {
          iVar6 = pQVar12->maxIconWidth;
          piVar18 = QSize::rwidth((QSize *)0x43d587);
          *piVar18 = iVar6 + *piVar18;
        }
        else {
          memset(local_380,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                     (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                     in_stack_fffffffffffff780,iVar6);
          local_6f0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_6f0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          LVar20 = in_RDX->direction;
          local_6f0 = (undefined1  [16])
                      positionRect(in_stack_fffffffffffff698,
                                   (QWidget *)
                                   CONCAT44(in_stack_fffffffffffff694.m_i,
                                            in_stack_fffffffffffff690.m_i),in_stack_fffffffffffff688
                                   ,(QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                                   in_stack_fffffffffffff67c,(QRect *)in_stack_fffffffffffff670,
                                   LVar21);
          piVar18 = &pQVar12->maxIconWidth;
          local_6f4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff64c,LVar20));
          piVar18 = std::max<int>(piVar18,&local_6f4);
          iVar6 = *piVar18;
          piVar18 = QSize::rwidth((QSize *)0x43d551);
          *piVar18 = iVar6 + 4 + *piVar18;
          QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
        }
        local_6fc = QRenderRule::adjustSize
                              (in_stack_fffffffffffff670,(QSize *)in_stack_fffffffffffff668);
        local_5b8 = QRenderRule::boxSize
                              (in_stack_fffffffffffff668,
                               (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660
                                                ),
                               CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
      auVar1._8_8_ = local_674._8_8_;
      auVar1._0_8_ = local_674._0_8_;
      if (bVar3) break;
    }
    goto LAB_0043e22c;
  case 9:
  case 10:
  case 0xd:
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if (!bVar3) {
      bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650);
      if (!bVar3) goto LAB_0043e22c;
    }
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    local_5b8 = local_5c8;
    break;
  case 0xb:
    memset(local_490,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
               (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               in_stack_fffffffffffff780,iVar6);
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if (((bVar3) ||
        (bVar3 = QRenderRule::hasNativeBorder
                           ((QRenderRule *)
                            CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660)), !bVar3))
       || (((byte)QStack_480.font & 1) != 0)) {
      uVar22 = 0;
      local_720.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_720.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_720.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x43d8c0);
      pQVar15 = qstyleoption_cast<QStyleOptionTab_const*>(in_RDX);
      if (pQVar15 != (QStyleOptionTab *)0x0) {
        QIcon::isNull();
        bVar3 = verticalTabs(pQVar15->shape);
        uVar22 = (uint)bVar3 << 0x18;
        QString::operator=(&local_720,(QString *)&pQVar15->text);
      }
      bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
      if ((bVar3) ||
         (bVar3 = QRenderRule::hasNativeBorder
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660)), !bVar3)
         ) {
        QSize::QSize((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                     in_stack_fffffffffffff648);
        local_728 = ::operator+((QSize *)CONCAT44(in_stack_fffffffffffff664,
                                                  in_stack_fffffffffffff660),
                                (QSize *)CONCAT26(in_stack_fffffffffffff65e.ucs,
                                                  CONCAT24(in_stack_fffffffffffff65c,
                                                           in_stack_fffffffffffff658)));
        local_5c8 = local_728;
      }
      if (((byte)QStack_480.font & 1) != 0) {
        local_738 = &DAT_aaaaaaaaaaaaaaaa;
        local_738 = (undefined1 *)
                    QFontMetrics::size((int)in_RDX + 0x20,(QString *)0x800,(int)&local_720,
                                       (int *)0x0);
        iVar6 = QSize::width((QSize *)0x43da3f);
        if ((uVar22 & 0x1000000) == 0) {
          in_stack_fffffffffffff670 = (QRenderRule *)QSize::rwidth((QSize *)0x43da6e);
        }
        else {
          in_stack_fffffffffffff670 = (QRenderRule *)QSize::rheight((QSize *)0x43da5a);
        }
        in_stack_fffffffffffff670->features = in_stack_fffffffffffff670->features - iVar6;
        local_4a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_498 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffff668 = &QStack_480;
        QWidget::font(in_R8);
        QFont::resolve((QFont *)&local_4a0);
        local_740 = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_740,(QFont *)&local_4a0);
        local_748 = &DAT_aaaaaaaaaaaaaaaa;
        local_748 = (undefined1 *)
                    QFontMetrics::size((int)&local_740,(QString *)0x800,(int)&local_720,(int *)0x0);
        if ((uVar22 & 0x1000000) == 0) {
          in_stack_fffffffffffff658 = QSize::width((QSize *)0x43dbc4);
          piVar18 = QSize::rwidth((QSize *)0x43dbd5);
          *piVar18 = in_stack_fffffffffffff658 + *piVar18;
          local_754 = QSize::height((QSize *)0x43dbea);
          local_758 = QSize::height((QSize *)0x43dbfe);
          piVar18 = qMax<int>(&local_754,&local_758);
          in_stack_fffffffffffff65c = (undefined2)*piVar18;
          in_stack_fffffffffffff65e.ucs = (char16_t)((uint)*piVar18 >> 0x10);
          piVar18 = QSize::rheight((QSize *)0x43dc2d);
          *piVar18 = CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c);
        }
        else {
          in_stack_fffffffffffff660 = QSize::width((QSize *)0x43db46);
          piVar18 = QSize::rheight((QSize *)0x43db57);
          *piVar18 = in_stack_fffffffffffff660 + *piVar18;
          local_74c = QSize::height((QSize *)0x43db6c);
          local_750 = QSize::width((QSize *)0x43db80);
          piVar18 = qMax<int>(&local_74c,&local_750);
          in_stack_fffffffffffff664 = *piVar18;
          piVar18 = QSize::rwidth((QSize *)0x43dbaf);
          *piVar18 = in_stack_fffffffffffff664;
        }
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_740);
        QFont::~QFont((QFont *)&local_4a0);
      }
      local_760 = QRenderRule::adjustSize
                            (in_stack_fffffffffffff670,(QSize *)in_stack_fffffffffffff668);
      local_5b8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      local_82c = 1;
      QString::~QString((QString *)0x43dca4);
    }
    else {
      local_768 = QRenderRule::adjustSize
                            (in_stack_fffffffffffff670,(QSize *)in_stack_fffffffffffff668);
      local_82c = 2;
      local_5c8 = local_768;
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
joined_r0x0043dcf5:
    if (local_82c == 2) goto LAB_0043e22c;
    break;
  case 0xc:
    bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650);
    if ((!bVar3) && (bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650), !bVar3)) {
      bVar3 = QRenderRule::hasGeometry(in_stack_fffffffffffff650);
      if (!bVar3) goto LAB_0043e22c;
    }
    local_5b8 = QRenderRule::boxSize
                          (in_stack_fffffffffffff668,
                           (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                           CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    break;
  case 0xe:
  case 0x14:
    if (in_R8 != (QWidget *)0x0) {
      QWidget::parentWidget((QWidget *)0x43cd84);
    }
    pQVar10 = qobject_cast<QAbstractSpinBox*>((QObject *)0x43cda7);
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    if (pQVar10 == (QAbstractSpinBox *)0x0) {
      bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
      if (!bVar3) {
        bVar3 = QRenderRule::hasNativeBorder
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
        if (bVar3) goto LAB_0043e22c;
      }
      local_5b8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      auVar1._8_8_ = local_674._8_8_;
      auVar1._0_8_ = local_674._0_8_;
    }
    else {
      local_5b8 = *in_RCX;
    }
    break;
  case 0xf:
    pQVar8 = qstyleoption_cast<QStyleOptionSpinBox_const*>(in_RDX);
    LVar21 = (LayoutDirection)in_stack_fffffffffffff6d0;
    if (pQVar8 == (QStyleOptionSpinBox *)0x0) goto LAB_0043e22c;
    bVar3 = QRenderRule::baseStyleCanDraw
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
    ;
    if (bVar3) {
      pQVar7 = baseStyle((QStyleSheetStyle *)
                         CONCAT26(in_stack_fffffffffffff65e.ucs,
                                  CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
      local_5d0 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))
                                   (pQVar7,in_ESI,in_RDX,&local_5c8,in_R8);
      local_5c8 = local_5d0;
    }
    else if (pQVar8->buttonSymbols != NoButtons) {
      memset(local_140,0xaa,0x88);
      renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                 (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                 in_stack_fffffffffffff780,iVar6);
      bVar3 = QRenderRule::hasDrawable(in_stack_fffffffffffff650);
      if (bVar3) {
        local_5e0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_5e0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        LVar20 = in_RDX->direction;
        local_5e0 = (undefined1  [16])
                    positionRect(in_stack_fffffffffffff698,
                                 (QWidget *)
                                 CONCAT44(in_stack_fffffffffffff694.m_i,
                                          in_stack_fffffffffffff690.m_i),in_stack_fffffffffffff688,
                                 (QRenderRule *)
                                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                                 in_stack_fffffffffffff67c,(QRect *)in_stack_fffffffffffff670,LVar21
                                );
        iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff64c,LVar20));
        piVar18 = QSize::rwidth((QSize *)0x43c2e2);
        *piVar18 = iVar6 + *piVar18;
      }
      else {
        local_5e8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QRenderRule::size((QRenderRule *)
                          CONCAT26(in_stack_fffffffffffff65e.ucs,
                                   CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
        sz_00.ht.m_i = in_stack_fffffffffffff694.m_i;
        sz_00.wd.m_i = in_stack_fffffffffffff690.m_i;
        local_5e8 = defaultSize((QStyleSheetStyle *)in_stack_fffffffffffff688,
                                (QWidget *)
                                CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),sz_00,
                                (QRect *)CONCAT44(in_stack_fffffffffffff67c,
                                                  in_stack_fffffffffffff678),
                                (int)((ulong)in_stack_fffffffffffff670 >> 0x20));
        iVar6 = QSize::width((QSize *)0x43c36a);
        piVar18 = QSize::rwidth((QSize *)0x43c37e);
        *piVar18 = iVar6 + *piVar18;
      }
      QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
    }
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if (((bVar3) || (bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650), bVar3)) ||
       (bVar3 = QRenderRule::hasNativeBorder
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660)), !bVar3))
    {
      local_5f0 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
      local_5c8 = local_5f0;
    }
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    local_5b8 = local_5c8;
    break;
  default:
LAB_0043e22c:
    pQVar7 = baseStyle((QStyleSheetStyle *)
                       CONCAT26(in_stack_fffffffffffff65e.ucs,
                                CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
    local_5b8 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,in_ESI,in_RDX,&local_5c8,in_R8);
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    break;
  case 0x13:
    pQVar9 = qstyleoption_cast<QStyleOptionHeader_const*>(in_RDX);
    if (pQVar9 == (QStyleOptionHeader *)0x0) goto LAB_0043e22c;
    memset(local_250,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
               (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               in_stack_fffffffffffff780,iVar6);
    bVar3 = QRenderRule::hasGeometry(in_stack_fffffffffffff650);
    if ((((bVar3) || (bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650), bVar3)) ||
        (bVar3 = QRenderRule::hasNativeBorder
                           ((QRenderRule *)
                            CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660)), !bVar3))
       || ((local_230 & 1) != 0)) {
      local_620 = QRenderRule::adjustSize
                            (in_stack_fffffffffffff670,(QSize *)in_stack_fffffffffffff668);
      local_5c8 = local_620;
      bVar3 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660))
      ;
      if (!bVar3) {
        local_628 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar7 = baseStyle((QStyleSheetStyle *)
                           CONCAT26(in_stack_fffffffffffff65e.ucs,
                                    CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
        local_628 = (undefined1 *)
                    (**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,in_ESI,in_RDX,&local_5c8,in_R8);
        iVar6 = QSize::width((QSize *)0x43c7f2);
        if (iVar6 < 0) {
          QSize::width((QSize *)0x43c804);
          QSize::setWidth((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
        }
        iVar6 = QSize::height((QSize *)0x43c820);
        if (iVar6 < 0) {
          QSize::height((QSize *)0x43c832);
          QSize::setHeight((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
        }
      }
      bVar3 = QRenderRule::hasGeometry(in_stack_fffffffffffff650);
      if (!bVar3) {
        local_630 = &DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)in_stack_fffffffffffff650);
        bVar2 = QIcon::isNull();
        (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle + 0xe0)
        )(in_RDI,0x2e,pQVar9);
        if ((bVar2 & 1) == 0) {
          local_8fc = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                             super_QStyle + 0xe0))(in_RDI,0x3e,pQVar9);
        }
        else {
          local_8fc = 0;
        }
        local_634 = local_8fc;
        local_640 = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics
                  ((QFontMetrics *)&local_640,&(pQVar9->super_QStyleOption).fontMetrics);
        if ((local_230 & 1) != 0) {
          local_260 = &DAT_aaaaaaaaaaaaaaaa;
          local_258 = &DAT_aaaaaaaaaaaaaaaa;
          if (in_R8 == (QWidget *)0x0) {
            QFont::QFont((QFont *)&local_260,aQStack_240);
          }
          else {
            QWidget::font(in_R8);
            QFont::resolve((QFont *)&local_260);
          }
          QFontMetrics::QFontMetrics(local_648,(QFont *)&local_260);
          QFontMetrics::operator=
                    ((QFontMetrics *)in_stack_fffffffffffff650,
                     (QFontMetrics *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
          QFontMetrics::~QFontMetrics(local_648);
          QFont::~QFont((QFont *)&local_260);
        }
        local_650 = &DAT_aaaaaaaaaaaaaaaa;
        local_650 = (undefined1 *)
                    QFontMetrics::size((int)&local_640,(QString *)0x0,(int)pQVar9 + 0x48,(int *)0x0)
        ;
        local_654 = QSize::height((QSize *)0x43ca56);
        qMax<int>(&local_634,&local_654);
        QSize::setHeight((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
        QString::isNull((QString *)0x43cad8);
        QSize::width((QSize *)0x43cb1b);
        QSize::setWidth((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
        local_65c = QSize::expandedTo((QSize *)CONCAT26(in_stack_fffffffffffff65e.ucs,
                                                        CONCAT24(in_stack_fffffffffffff65c,
                                                                 in_stack_fffffffffffff658)),
                                      (QSize *)in_stack_fffffffffffff650);
        local_5c8 = local_65c;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_640);
      }
      local_5b8 = QRenderRule::size((QRenderRule *)
                                    CONCAT26(in_stack_fffffffffffff65e.ucs,
                                             CONCAT24(in_stack_fffffffffffff65c,
                                                      in_stack_fffffffffffff658)),
                                    (QSize *)in_stack_fffffffffffff650);
    }
    else {
      bVar3 = QRenderRule::baseStyleCanDraw
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      if (bVar3) {
        pQVar7 = baseStyle((QStyleSheetStyle *)
                           CONCAT26(in_stack_fffffffffffff65e.ucs,
                                    CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
        local_664 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))
                                     (pQVar7,in_ESI,in_RDX,&local_5c8,in_R8);
      }
      else {
        local_664 = QWindowsStyle::sizeFromContents
                              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,
                               in_stack_fffffffffffff6c0,
                               (QSize *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8
                                                ),in_stack_fffffffffffff6b0);
      }
      local_5c8 = local_664;
      bVar3 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),obj
                           ,in_stack_fffffffffffff714);
      if (bVar3) {
LAB_0043cc79:
        local_674._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_674._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_674 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                           super_QStyle + 0xc0))(in_RDI,0x11,in_RDX,in_R8);
        if (pQVar9->orientation == Horizontal) {
          iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648
                                                ));
          piVar18 = QSize::rwidth((QSize *)0x43ccff);
          *piVar18 = iVar6 + *piVar18;
        }
        else {
          iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff64c,
                                                  in_stack_fffffffffffff648));
          piVar18 = QSize::rheight((QSize *)0x43cd2d);
          *piVar18 = iVar6 + *piVar18;
        }
      }
      else {
        bVar3 = hasStyleRule((QStyleSheetStyle *)
                             CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),
                             obj,in_stack_fffffffffffff714);
        if (bVar3) goto LAB_0043cc79;
      }
      local_5b8 = local_5c8;
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
    auVar1 = local_674;
    break;
  case 0x15:
    pQVar16 = qstyleoption_cast<QStyleOptionComplex_const*>(in_RDX);
    if (pQVar16 == (QStyleOptionComplex *)0x0) goto LAB_0043e22c;
    bVar3 = hasStyleRule((QStyleSheetStyle *)
                         CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),obj,
                         in_stack_fffffffffffff714);
    if ((!bVar3) &&
       (bVar3 = hasStyleRule((QStyleSheetStyle *)
                             CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),
                             obj,in_stack_fffffffffffff714), !bVar3)) {
      bVar3 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff694.m_i,in_stack_fffffffffffff690.m_i),obj
                           ,in_stack_fffffffffffff714);
      if (!bVar3) goto LAB_0043e22c;
    }
    local_780 = &DAT_aaaaaaaaaaaaaaaa;
    local_778 = &DAT_aaaaaaaaaaaaaaaa;
    local_770 = &DAT_aaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT26(in_stack_fffffffffffff65e.ucs,
                                CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)),
               (size_t)in_stack_fffffffffffff650);
    sh.m_size._4_4_ = in_stack_fffffffffffff664;
    sh.m_size._0_4_ = in_stack_fffffffffffff660;
    sh.m_data = (char *)in_stack_fffffffffffff668;
    QRenderRule::styleHint(in_stack_fffffffffffff650,sh);
    ::QVariant::toList();
    ::QVariant::~QVariant(&local_28);
    bVar3 = QList<QVariant>::isEmpty((QList<QVariant> *)0x43de25);
    if (bVar3) {
      QByteArrayView::QByteArrayView<4ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (char (*) [4])
                 CONCAT26(in_stack_fffffffffffff65e.ucs,
                          CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
      layout_00.m_size._4_4_ = in_stack_fffffffffffff694.m_i;
      layout_00.m_size._0_4_ = in_stack_fffffffffffff690.m_i;
      layout_00.m_data = (storage_type *)in_stack_fffffffffffff698;
      subControlLayout(layout_00);
      QList<QVariant>::operator=
                ((QList<QVariant> *)in_stack_fffffffffffff650,
                 (QList<QVariant> *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      QList<QVariant>::~QList((QList<QVariant> *)0x43de7e);
    }
    local_7ac[0] = 0;
    local_7b8.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_7b8 = QList<QVariant>::begin((QList<QVariant> *)in_stack_fffffffffffff650);
    local_7c0.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_7c0 = QList<QVariant>::end((QList<QVariant> *)in_stack_fffffffffffff650);
    while( true ) {
      local_7c8 = local_7c0.i;
      bVar3 = QList<QVariant>::const_iterator::operator!=(&local_7b8,local_7c0);
      if (!bVar3) break;
      pQVar17 = QList<QVariant>::const_iterator::operator*(&local_7b8);
      iVar6 = ::QVariant::toInt((bool *)pQVar17);
      if ((0x3d < iVar6) && (iVar6 < 0x41)) {
        local_7cc.i = (Int)QFlags<QStyle::SubControl>::operator&
                                     ((QFlags<QStyle::SubControl> *)in_stack_fffffffffffff650,
                                      in_stack_fffffffffffff64c);
        bVar3 = QFlags<QStyle::SubControl>::operator!((QFlags<QStyle::SubControl> *)&local_7cc);
        if (!bVar3) {
          memset(local_528,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                     (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                     in_stack_fffffffffffff780,(int)((ulong)pQVar16 >> 0x20));
          local_7d4 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          local_7d4 = QRenderRule::size((QRenderRule *)
                                        CONCAT26(in_stack_fffffffffffff65e.ucs,
                                                 CONCAT24(in_stack_fffffffffffff65c,
                                                          in_stack_fffffffffffff658)));
          QSize::width((QSize *)0x43e04f);
          local_7d8 = QSize::height((QSize *)0x43e06a);
          piVar18 = qMax<int>(local_7ac,&local_7d8);
          local_7ac[0] = *piVar18;
          QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
        }
      }
      QList<QVariant>::const_iterator::operator++(&local_7b8);
    }
    QSize::QSize((QSize *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                 in_stack_fffffffffffff648);
    QList<QVariant>::~QList((QList<QVariant> *)0x43e0e1);
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
    break;
  case 0x16:
    memset(local_5b0,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
               (QObject *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
               in_stack_fffffffffffff780,iVar6);
    pQVar7 = baseStyle((QStyleSheetStyle *)
                       CONCAT26(in_stack_fffffffffffff65e.ucs,
                                CONCAT24(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)));
    local_5c8 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,in_ESI,in_RDX,in_RCX,in_R8);
    local_5c8 = QRenderRule::adjustSize
                          (in_stack_fffffffffffff670,(QSize *)in_stack_fffffffffffff668);
    bVar3 = QRenderRule::hasBox(in_stack_fffffffffffff650);
    if ((bVar3) || (bVar3 = QRenderRule::hasBorder(in_stack_fffffffffffff650), bVar3)) {
      local_5c8 = QRenderRule::boxSize
                            (in_stack_fffffffffffff668,
                             (QSize *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                             CONCAT22(in_stack_fffffffffffff65e.ucs,in_stack_fffffffffffff65c));
    }
    local_5b8 = local_5c8;
    QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
    auVar1._8_8_ = local_674._8_8_;
    auVar1._0_8_ = local_674._0_8_;
  }
  local_674 = auVar1;
  QRenderRule::~QRenderRule(in_stack_fffffffffffff650);
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_5b9);
LAB_0043e291:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_5b8;
  }
  __stack_chk_fail();
}

Assistant:

QSize QStyleSheetStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                         const QSize &csz, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->sizeFromContents(ct, opt, csz, w))

    QRenderRule rule = renderRule(w, opt);
    QSize sz = rule.adjustSize(csz);

    switch (ct) {
#if QT_CONFIG(spinbox)
    case CT_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (rule.baseStyleCanDraw()) {
                sz = baseStyle()->sizeFromContents(ct, opt, sz, w);
            } else if (spinbox->buttonSymbols != QAbstractSpinBox::NoButtons) {
                // Add some space for the up/down buttons
                QRenderRule subRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
                if (subRule.hasDrawable()) {
                    QRect r = positionRect(w, rule, subRule, PseudoElement_SpinBoxUpButton,
                                           opt->rect, opt->direction);
                    sz.rwidth() += r.width();
                } else {
                    QSize defaultUpSize = defaultSize(w, subRule.size(), spinbox->rect, PseudoElement_SpinBoxUpButton);
                    sz.rwidth() += defaultUpSize.width();
                }
            }
            if (rule.hasBox() || rule.hasBorder() || !rule.hasNativeBorder())
                sz = rule.boxSize(sz);
            return sz;
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CT_ToolButton:
        if (rule.hasBox() || !rule.hasNativeBorder() || !rule.baseStyleCanDraw())
            sz += QSize(3, 3); // ### broken QToolButton
        Q_FALLTHROUGH();
    case CT_ComboBox:
    case CT_PushButton:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            if (ct == CT_ComboBox) {
                //add some space for the drop down.
                QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                QRect comboRect = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                //+2 because there is hardcoded margins in QCommonStyle::drawControl(CE_ComboBoxLabel)
                sz += QSize(comboRect.width() + 2, 0);
            }
            return rule.boxSize(sz);
        }
        sz = rule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                     : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
        return rule.boxSize(sz, Margin);

    case CT_HeaderSection: {
            if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
                if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
                    sz = subRule.adjustSize(csz);
                    if (!sz.isValid()) {
                        // Try to set the missing values based on the base style.
                        const auto baseSize = baseStyle()->sizeFromContents(ct, opt, sz, w);
                        if (sz.width() < 0)
                            sz.setWidth(baseSize.width());
                        if (sz.height() < 0)
                            sz.setHeight(baseSize.height());
                    }
                    if (!subRule.hasGeometry()) {
                        QSize nativeContentsSize;
                        bool nullIcon = hdr->icon.isNull();
                        const int margin = pixelMetric(QStyle::PM_HeaderMargin, hdr, w);
                        int iconSize = nullIcon ? 0 : pixelMetric(QStyle::PM_SmallIconSize, hdr, w);
                        QFontMetrics fm = hdr->fontMetrics;
                        if (subRule.hasFont) {
                            QFont styleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                            fm = QFontMetrics(styleFont);
                        }
                        const QSize txt = fm.size(0, hdr->text);
                        nativeContentsSize.setHeight(margin + qMax(iconSize, txt.height()) + margin);
                        nativeContentsSize.setWidth((nullIcon ? 0 : margin) + iconSize
                                                    + (hdr->text.isNull() ? 0 : margin) + txt.width() + margin);
                        sz = sz.expandedTo(nativeContentsSize);
                    }
                    return subRule.size(sz);
                }
                sz = subRule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                                : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
                if (hasStyleRule(w, PseudoElement_HeaderViewDownArrow)
                 || hasStyleRule(w, PseudoElement_HeaderViewUpArrow)) {
                    const QRect arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (hdr->orientation == Qt::Horizontal)
                        sz.rwidth() += arrowRect.width();
                    else
                        sz.rheight() += arrowRect.height();
                }
                return sz;
            }
        }
        break;
    case CT_GroupBox:
    case CT_LineEdit:
#if QT_CONFIG(spinbox)
        if (qobject_cast<QAbstractSpinBox *>(w ? w->parentWidget() : nullptr))
            return csz; // we only care about the size hint of the line edit
#endif
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return rule.boxSize(sz);
        }
        break;

    case CT_CheckBox:
    case CT_RadioButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
                bool isRadio = (ct == CT_RadioButton);
                int iw = pixelMetric(isRadio ? PM_ExclusiveIndicatorWidth
                                             : PM_IndicatorWidth, btn, w);
                int ih = pixelMetric(isRadio ? PM_ExclusiveIndicatorHeight
                                             : PM_IndicatorHeight, btn, w);

                int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing
                                                  : PM_CheckBoxLabelSpacing, btn, w);
                sz.setWidth(sz.width() + iw + spacing);
                sz.setHeight(qMax(sz.height(), ih));
                return rule.boxSize(sz);
            }
        }
        break;

    case CT_Menu:
    case CT_MenuBar: // already has everything!
    case CT_ScrollBar:
        if (rule.hasBox() || rule.hasBorder())
            return sz;
        break;

    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            PseudoElement pe = (mi->menuItemType == QStyleOptionMenuItem::Separator)
                                    ? PseudoElement_MenuSeparator : PseudoElement_Item;
            QRenderRule subRule = renderRule(w, opt, pe);
            if ((pe == PseudoElement_MenuSeparator) && subRule.hasContentsSize()) {
                return QSize(sz.width(), subRule.size().height());
            }
            if ((pe == PseudoElement_Item) && (subRule.hasBox() || subRule.hasBorder() || subRule.hasFont)) {
                bool drawCheckMark = mi->menuHasCheckableItems;
#if QT_CONFIG(combobox)
                if (qobject_cast<const QComboBox *>(w))
                    drawCheckMark = false; // ignore the checkmarks provided by the QComboMenuDelegate
#endif
                QSize sz(csz);
                if (subRule.hasFont) {
                    QFontMetrics fm(subRule.font.resolve(mi->font));
                    const QRect r = fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, mi->text);
                    sz = sz.expandedTo(r.size());
                }
                if (mi->text.contains(u'\t'))
                    sz.rwidth() += 12; //as in QCommonStyle
                if (!mi->icon.isNull()) {
                    const int pmSmall = pixelMetric(PM_SmallIconSize);
                    const QSize pmSize = mi->icon.actualSize(QSize(pmSmall, pmSmall));
                    sz.rwidth() += std::max(mi->maxIconWidth, pmSize.width()) + 4;
                } else if (drawCheckMark) {
                    QRenderRule subSubRule = renderRule(w, opt, PseudoElement_MenuCheckMark);
                    QRect checkmarkRect = positionRect(w, subRule, subSubRule, PseudoElement_MenuCheckMark, opt->rect, opt->direction);
                    sz.rwidth() += std::max(mi->maxIconWidth, checkmarkRect.width()) + 4;
                } else {
                    sz.rwidth() += mi->maxIconWidth;
                }
                return subRule.boxSize(subRule.adjustSize(sz));
            }
        }
        break;

    case CT_Splitter:
    case CT_MenuBarItem: {
        PseudoElement pe = (ct == CT_Splitter) ? PseudoElement_SplitterHandle : PseudoElement_Item;
        QRenderRule subRule = renderRule(w, opt, pe);
        if (subRule.hasBox() || subRule.hasBorder())
            return subRule.boxSize(sz);
        break;
                        }

    case CT_ProgressBar:
    case CT_SizeGrip:
        return (rule.hasContentsSize())
            ? rule.size(sz)
            : rule.boxSize(baseStyle()->sizeFromContents(ct, opt, sz, w));
        break;

    case CT_Slider:
        if (rule.hasBorder() || rule.hasBox() || rule.hasGeometry())
            return rule.boxSize(sz);
        break;

#if QT_CONFIG(tabbar)
    case CT_TabBarTab: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            int spaceForIcon = 0;
            bool vertical = false;
            QString text;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                if (!tab->icon.isNull())
                    spaceForIcon = 6 /* icon offset */ + 4 /* spacing */ + 2 /* magic */; // ###: hardcoded to match with common style
                vertical = verticalTabs(tab->shape);
                text = tab->text;
            }
            if (subRule.hasBox() || !subRule.hasNativeBorder())
                sz = csz + QSize(vertical ? 0 : spaceForIcon, vertical ? spaceForIcon : 0);
            if (subRule.hasFont) {
                // first we remove the space needed for the text using the default font
                const QSize oldTextSize = opt->fontMetrics.size(Qt::TextShowMnemonic, text);
                (vertical ? sz.rheight() : sz.rwidth()) -= oldTextSize.width();

                // then we add the space needed when using the rule font to the relevant
                // dimension, and constraint the other dimension to the maximum to make
                // sure we don't grow, but also don't clip icons or buttons.
                const QFont ruleFont = subRule.font.resolve(w->font());
                const QFontMetrics fm(ruleFont);
                const QSize textSize = fm.size(Qt::TextShowMnemonic, text);
                if (vertical) {
                    sz.rheight() += textSize.width();
                    sz.rwidth() = qMax(textSize.height(), sz.width());
                } else {
                    sz.rwidth() += textSize.width();
                    sz.rheight() = qMax(textSize.height(), sz.height());
                }
            }

            return subRule.boxSize(subRule.adjustSize(sz));
        }
        sz = subRule.adjustSize(csz);
        break;
    }
#endif // QT_CONFIG(tabbar)

    case CT_MdiControls:
        if (const QStyleOptionComplex *ccOpt = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
            if (!hasStyleRule(w, PseudoElement_MdiCloseButton)
                && !hasStyleRule(w, PseudoElement_MdiNormalButton)
                && !hasStyleRule(w, PseudoElement_MdiMinButton))
                break;

            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int width = 0, height = 0;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl sc = knownPseudoElements[layoutButton].subControl;
                if (!(ccOpt->subControls & sc))
                    continue;
                QRenderRule subRule = renderRule(w, opt, layoutButton);
                QSize sz = subRule.size();
                width += sz.width();
                height = qMax(height, sz.height());
            }

            return QSize(width, height);
        }
        break;

#if QT_CONFIG(itemviews)
    case CT_ItemViewItem: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
        sz = baseStyle()->sizeFromContents(ct, opt, csz, w);
        sz = subRule.adjustSize(sz);
        if (subRule.hasBox() || subRule.hasBorder())
            sz = subRule.boxSize(sz);
        return sz;
                      }
#endif // QT_CONFIG(itemviews)

    default:
        break;
    }

    return baseStyle()->sizeFromContents(ct, opt, sz, w);
}